

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::setExternalNoNamespaceSchemaLocation
          (AbstractDOMParser *this,XMLCh *noNamespaceSchemaLocation)

{
  short *psVar1;
  XMLScanner *pXVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t __n;
  XMLCh *__dest;
  
  pXVar2 = this->fScanner;
  (*pXVar2->fMemoryManager->_vptr_MemoryManager[4])
            (pXVar2->fMemoryManager,pXVar2->fExternalNoNamespaceSchemaLocation);
  if (noNamespaceSchemaLocation == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)noNamespaceSchemaLocation + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar3 = (*pXVar2->fMemoryManager->_vptr_MemoryManager[3])(pXVar2->fMemoryManager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar3);
    memcpy(__dest,noNamespaceSchemaLocation,__n);
  }
  pXVar2->fExternalNoNamespaceSchemaLocation = __dest;
  return;
}

Assistant:

void AbstractDOMParser::setExternalNoNamespaceSchemaLocation(const XMLCh* const noNamespaceSchemaLocation)
{
    fScanner->setExternalNoNamespaceSchemaLocation(noNamespaceSchemaLocation);
}